

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

any __thiscall
cs_impl::any::make_protect<cs::object_method,cs_impl::any_const&,cs_impl::any&>
          (any *this,any *args,any *args_1)

{
  holder<cs::object_method> *this_00;
  proxy *ppVar1;
  
  if ((DAT_003453f0 == 0) || (cs::global_thread_counter != 0)) {
    this_00 = (holder<cs::object_method> *)operator_new(0x20);
  }
  else {
    this_00 = (holder<cs::object_method> *)(&cs::null_pointer)[DAT_003453f0];
    DAT_003453f0 = DAT_003453f0 + -1;
  }
  holder<cs::object_method>::holder<cs_impl::any_const&,cs_impl::any&>(this_00,args,args_1);
  if ((DAT_00346850 == 0) || (cs::global_thread_counter != 0)) {
    ppVar1 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar1 = (proxy *)(&cs::null_pointer)[DAT_00346850];
    DAT_00346850 = DAT_00346850 + -1;
  }
  ppVar1->is_rvalue = false;
  ppVar1->protect_level = 1;
  ppVar1->refcount = 1;
  ppVar1->data = &this_00->super_baseHolder;
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}